

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsWin.c
# Opt level: O3

void Abc_MfsComputeRoots_rec(Abc_Obj_t *pNode,int nLevelMax,int nFanoutLimit,Vec_Ptr_t *vRoots)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Abc_Ntk_t *pAVar5;
  Abc_Ntk_t *pAVar6;
  void **ppvVar7;
  int Fill;
  ulong uVar8;
  long lVar9;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsWin.c"
                  ,0x4c,"void Abc_MfsComputeRoots_rec(Abc_Obj_t *, int, int, Vec_Ptr_t *)");
  }
  pAVar5 = pNode->pNtk;
  iVar1 = pNode->Id;
  Vec_IntFillExtra(&pAVar5->vTravIds,iVar1 + 1,nFanoutLimit);
  if (((long)iVar1 < 0) || ((pAVar5->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar6 = pNode->pNtk;
  iVar2 = pAVar6->nTravIds;
  if ((pAVar5->vTravIds).pArray[iVar1] != iVar2) {
    iVar1 = pNode->Id;
    Vec_IntFillExtra(&pAVar6->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar6->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar6->vTravIds).pArray[iVar1] = iVar2;
    uVar3 = (pNode->vFanouts).nSize;
    if (nFanoutLimit < (int)uVar3) {
LAB_004cc384:
      uVar3 = vRoots->nSize;
      if (uVar3 == vRoots->nCap) {
        if ((int)uVar3 < 0x10) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vRoots->pArray,0x80);
          }
          vRoots->pArray = ppvVar7;
          vRoots->nCap = 0x10;
        }
        else {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vRoots->pArray,(ulong)uVar3 << 4);
          }
          vRoots->pArray = ppvVar7;
          vRoots->nCap = uVar3 * 2;
        }
      }
      else {
        ppvVar7 = vRoots->pArray;
      }
      iVar1 = vRoots->nSize;
      vRoots->nSize = iVar1 + 1;
      ppvVar7[iVar1] = pNode;
    }
    else if (0 < (int)uVar3) {
      uVar8 = 0;
      do {
        uVar4 = *(uint *)((long)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[uVar8]] + 0x14);
        if ((nLevelMax < (int)(uVar4 >> 0xc)) || ((uVar4 & 0xf) - 3 < 2)) goto LAB_004cc384;
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
      if (0 < (int)uVar3) {
        lVar9 = 0;
        do {
          Abc_MfsComputeRoots_rec
                    ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar9]],
                     nLevelMax,nFanoutLimit,vRoots);
          lVar9 = lVar9 + 1;
        } while (lVar9 < (pNode->vFanouts).nSize);
      }
    }
  }
  return;
}

Assistant:

void Abc_MfsComputeRoots_rec( Abc_Obj_t * pNode, int nLevelMax, int nFanoutLimit, Vec_Ptr_t * vRoots )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Abc_ObjIsNode(pNode) );
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    // check if the node should be the root
    if ( Abc_MfsComputeRootsCheck( pNode, nLevelMax, nFanoutLimit ) )
        Vec_PtrPush( vRoots, pNode );
    else // if not, explore its fanouts
        Abc_ObjForEachFanout( pNode, pFanout, i )
            Abc_MfsComputeRoots_rec( pFanout, nLevelMax, nFanoutLimit, vRoots );
}